

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     rox<(InstructionSet::M68k::Operation)99,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 2;
  uVar2 = uVar3 - 0x21;
  if (uVar3 < 0x21) {
    uVar2 = uVar3;
  }
  if (uVar2 == 0) {
    status->carry_flag = status->extend_flag;
    uVar2 = *destination;
  }
  else {
    bVar1 = (byte)uVar2;
    uVar3 = *destination;
    uVar4 = (ulong)(1 << (bVar1 - 1 & 0x1f) & uVar3);
    status->carry_flag = uVar4;
    if (uVar2 == 1) {
      uVar2 = (uint)(status->extend_flag != 0) << 0x1f | uVar3 >> 1;
    }
    else if (uVar2 == 0x20) {
      uVar2 = (uint)(status->extend_flag != 0) + uVar3 * 2;
    }
    else {
      uVar2 = uVar3 << (0x21 - bVar1 & 0x1f) | uVar3 >> (bVar1 & 0x1f) |
              ((uint)(status->extend_flag != 0) << 0x1f) >> (bVar1 - 1 & 0x1f);
    }
    *destination = uVar2;
    status->extend_flag = uVar4;
  }
  status->zero_result = (ulong)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x80000000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}